

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::upPrePartials
          (BeagleCPUImpl<double,_1,_0> *this,bool byPartition,int *operations,int count,
          int cumulativeScaleIndex)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int in_ECX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  undefined4 in_R8D;
  double *scalingFactors;
  int rescale;
  int endPattern;
  int startPattern;
  double *destPartials;
  double *matrices2;
  double *matrices1;
  int *tipStates2;
  double *partials2;
  double *partials1;
  int currentPartition;
  int siblingTransMatIndex;
  int siblingIndex;
  int parentTransMatIndex;
  int parentIndex;
  int readScalingIndex;
  int writeScalingIndex;
  int parIndex;
  int numOps;
  int op;
  double *cumulativeScaleBuffer;
  undefined8 local_98;
  int local_8c;
  undefined4 local_88;
  undefined4 local_84;
  int local_50;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined4 local_20;
  int local_1c;
  long local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_28 = 0;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
    local_30 = 7;
    if ((local_9 & 1) != 0) {
      local_30 = 9;
    }
    local_34 = *(int *)(local_18 + (long)(local_2c * local_30) * 4);
    local_38 = *(int *)(local_18 + (long)(local_2c * local_30 + 1) * 4);
    local_3c = *(int *)(local_18 + (long)(local_2c * local_30 + 2) * 4);
    iVar1 = *(int *)(local_18 + (long)(local_2c * local_30 + 5) * 4);
    local_50 = 0;
    if ((local_9 & 1) != 0) {
      local_50 = *(int *)(local_18 + (long)(local_2c * local_30 + 7) * 4);
      local_20 = *(undefined4 *)(local_18 + (long)(local_2c * local_30 + 8) * 4);
    }
    uVar2 = *(undefined8 *)
             (in_RDI[0x16] + (long)*(int *)(local_18 + (long)(local_2c * local_30 + 3) * 4) * 8);
    uVar3 = *(undefined8 *)(in_RDI[0x16] + (long)iVar1 * 8);
    lVar4 = *(long *)(in_RDI[0x17] + (long)iVar1 * 8);
    uVar5 = *(undefined8 *)
             (in_RDI[0x1b] + (long)*(int *)(local_18 + (long)(local_2c * local_30 + 4) * 4) * 8);
    uVar6 = *(undefined8 *)
             (in_RDI[0x1b] + (long)*(int *)(local_18 + (long)(local_2c * local_30 + 6) * 4) * 8);
    uVar7 = *(undefined8 *)(in_RDI[0x16] + (long)local_34 * 8);
    local_84 = 0;
    local_88 = *(undefined4 *)((long)in_RDI + 0x14);
    if ((local_9 & 1) != 0) {
      local_84 = *(undefined4 *)(in_RDI[0x12] + (long)local_50 * 4);
      local_88 = *(undefined4 *)(in_RDI[0x12] + (long)(local_50 + 1) * 4);
    }
    local_8c = -1;
    local_98 = 0;
    if ((in_RDI[0xb] & 0x80U) == 0) {
      if ((in_RDI[0xb] & 0x100U) == 0) {
        if ((in_RDI[0xb] & 0x2000000U) == 0) {
          if (local_38 < 0) {
            if (-1 < local_3c) {
              local_8c = 0;
              local_98 = *(undefined8 *)(in_RDI[0x18] + (long)local_3c * 8);
            }
          }
          else {
            local_8c = 1;
            local_98 = *(undefined8 *)(in_RDI[0x18] + (long)local_38 * 8);
          }
        }
        else {
          local_8c = 1;
          (**(code **)(*in_RDI + 0x110))(in_RDI,&local_3c,1,local_20);
          local_98 = *(undefined8 *)(in_RDI[0x18] + (long)local_38 * 8);
        }
      }
      else {
        local_8c = 1;
        local_98 = *(undefined8 *)(in_RDI[0x18] + (long)(local_34 - (int)in_RDI[2]) * 8);
      }
    }
    else {
      *(undefined4 *)(in_RDI[0x1a] + (long)(local_34 - (int)in_RDI[2]) * 4) = 0;
      local_8c = 2;
    }
    if (lVar4 == 0) {
      (**(code **)(*in_RDI + 0x220))(in_RDI,uVar7,uVar2,uVar5,uVar3,uVar6,local_84,local_88);
      if (local_8c == 1) {
        if ((local_9 & 1) == 0) {
          (**(code **)(*in_RDI + 0x2c8))(in_RDI,uVar7,local_98,local_28,0);
        }
        else {
          (**(code **)(*in_RDI + 0x2d0))(in_RDI,uVar7,local_98,local_28,0,local_50);
        }
      }
    }
    else {
      (**(code **)(*in_RDI + 0x228))(in_RDI,uVar7,uVar2,uVar5,lVar4,uVar6,local_84,local_88);
      if (local_8c == 1) {
        if ((local_9 & 1) == 0) {
          (**(code **)(*in_RDI + 0x2c8))(in_RDI,uVar7,local_98,local_28,0);
        }
        else {
          (**(code **)(*in_RDI + 0x2d0))(in_RDI,uVar7,local_98,local_28,0,local_50);
        }
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPrePartials(bool byPartition,
                                                     const int* operations,
                                                     int count,
                                                     int cumulativeScaleIndex) {

    REALTYPE* cumulativeScaleBuffer = NULL;  // don't need to normalize/transform back preOrderPartials, off by constant rescaling factor is fine
//    if (cumulativeScaleIndex != BEAGLE_OP_NONE)
//        cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];

    for (int op = 0; op < count; op++) {

        int numOps = BEAGLE_OP_COUNT;
        if (byPartition)
            numOps = BEAGLE_PARTITION_OP_COUNT;

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr, "op[%d] = ", op);
            for (int j = 0; j < numOps; j++) {
                std::cerr << operations[op*numOps+j] << " ";
            }
            fprintf(stderr, "\n");
        }

        // create a list of partial likelihood update operations
        // the order is [dest, destScaling, source1, matrix1, source2, matrix2]
        // destPartials point to the pre-order partials
        // partials1 = pre-order partials of the parent node
        // matrices1 = Ptr matrices of the current node (to the parent node)
        // partials2 = post-order partials of the sibling node
        // matrices2 = Ptr matrices of the sibling node (to the parent node)
        const int parIndex = operations[op * numOps];
        const int writeScalingIndex = operations[op * numOps + 1];
        const int readScalingIndex = operations[op * numOps + 2];
        const int parentIndex = operations[op * numOps + 3];
        const int parentTransMatIndex = operations[op * numOps + 4];
        const int siblingIndex = operations[op * numOps + 5];
        const int siblingTransMatIndex = operations[op * numOps + 6];
        int currentPartition = 0;
        if (byPartition) {
            currentPartition = operations[op * numOps + 7];
            cumulativeScaleIndex = operations[op * numOps + 8];
//            if (cumulativeScaleIndex != BEAGLE_OP_NONE)
//                cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
//            else
//                cumulativeScaleBuffer = NULL;
        }


        /// non-root nodes, can be a tip
        const REALTYPE *partials1 = gPartials[parentIndex];
        const REALTYPE *partials2 = gPartials[siblingIndex];

        const int *tipStates2 = gTipStates[siblingIndex];

        const REALTYPE *matrices1 = gTransitionMatrices[parentTransMatIndex];
        const REALTYPE *matrices2 = gTransitionMatrices[siblingTransMatIndex];


        REALTYPE *destPartials = gPartials[parIndex];

        int startPattern = 0;
        int endPattern = kPatternCount;
        if (byPartition) {
            startPattern = gPatternPartitionsStartPatterns[currentPartition];
            endPattern = gPatternPartitionsStartPatterns[currentPartition + 1];
        }

        int rescale = BEAGLE_OP_NONE;
        REALTYPE *scalingFactors = NULL;

        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            gActiveScalingFactors[parIndex - kTipCount] = 0;
//            if (siblingStates == 0)
                rescale = 2;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            rescale = 1;
            scalingFactors = gScaleBuffers[parIndex - kTipCount];
        } else if (kFlags &
                   BEAGLE_FLAG_SCALING_DYNAMIC) { // TODO: this is a quick and dirty implementation just so it returns correct results
//            if (siblingStates == 0) {
                rescale = 1;
                removeScaleFactors(&readScalingIndex, 1, cumulativeScaleIndex);
                scalingFactors = gScaleBuffers[writeScalingIndex];
//            }
        } else if (writeScalingIndex >= 0) {
            rescale = 1;
            scalingFactors = gScaleBuffers[writeScalingIndex];
        } else if (readScalingIndex >= 0) {
            rescale = 0;
            scalingFactors = gScaleBuffers[readScalingIndex];
        }

        if (DEBUGGING_OUTPUT) {
            std::cerr << "Rescale= " << rescale << " writeIndex= " << writeScalingIndex
                      << " readIndex = " << readScalingIndex << "\n";
        }

        /// destPartials point to the pre-order partials
        /// partials1 = pre-order partials of the parent node
        /// matrices1 = Ptr matrices of the current node (to the parent node)
        /// partials2 = post-order partials of the sibling node
        /// matrices2 = Ptr matrices of the sibling node (to the parent node)
        /// comment out all conditions that's not implemented

        if (tipStates2 != NULL) {
            calcPrePartialsStates(destPartials, partials1, matrices1, tipStates2, matrices2,
                                  startPattern, endPattern);

            if (rescale == 1) {// Recompute scaleFactors
                if (byPartition) {
                    rescalePartialsByPartition(destPartials, scalingFactors, cumulativeScaleBuffer, 0,
                                               currentPartition);
                } else {
                    rescalePartials(destPartials, scalingFactors, cumulativeScaleBuffer, 0);
                }
            }

        } else {
//            if (rescale == 2) {
//                //                    int sIndex = parIndex - kTipCount;
//                //                    calcPartialsPartialsAutoScaling(destPartials,partials1,matrices1,partials2,matrices2,
//                //                                                    &gActiveScalingFactors[sIndex]);
//                //                    if (gActiveScalingFactors[sIndex])
//                //                        autoRescalePartials(destPartials, gAutoScaleBuffers[sIndex]);
//
//            } else if (rescale == 0) {
//                //                    calcPartialsPartialsFixedScaling(destPartials,partials1,matrices1,partials2,
//                //                                                     matrices2,scalingFactors,startPattern,endPattern);
//            } else {

                calcPrePartialsPartials(destPartials, partials1, matrices1, partials2, matrices2,
                                        startPattern, endPattern);

                if (rescale == 1) {// Recompute scaleFactors
                    if (byPartition) {
                        rescalePartialsByPartition(destPartials, scalingFactors, cumulativeScaleBuffer, 0,
                                                   currentPartition);
                    } else {
                        rescalePartials(destPartials, scalingFactors, cumulativeScaleBuffer, 0);
                    }
                }
//            }
        }


//        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
//            int parScalingIndex = parIndex - kTipCount;
//            int child1ScalingIndex = parentIndex - kTipCount;
//            int child2ScalingIndex = siblingIndex - kTipCount;
//            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
//                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 2, parScalingIndex);
//            } else if (child1ScalingIndex >= 0) {
//                int scalingIndices[1] = {child1ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
//            } else if (child2ScalingIndex >= 0) {
//                int scalingIndices[1] = {child2ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
//            }
//        }

        if (DEBUGGING_OUTPUT) {
            if (scalingFactors != NULL && rescale == 0) {
                for (int i = 0; i < kPatternCount; i++)
                    fprintf(stderr, "old scaleFactor[%d] = %.5f\n", i, scalingFactors[i]);
            }
            fprintf(stderr, "Result partials:\n");
            for (int i = 0; i < kPartialsSize; i++)
                fprintf(stderr, "destP[%d] = %.5f\n", i, destPartials[i]);
        }
    }

    return BEAGLE_SUCCESS;
}